

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O2

void __thiscall agg::trans_double_path::finalize_paths(trans_double_path *this)

{
  trans_double_path *this_00;
  double dVar1;
  
  if ((((this->m_status1 == making_path) &&
       (1 < (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_size)) &&
      (this->m_status2 == making_path)) &&
     (1 < (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_size)) {
    this_00 = this;
    dVar1 = finalize_path(this,&this->m_src_vertices1);
    this->m_kindex1 = dVar1;
    dVar1 = finalize_path(this_00,&this->m_src_vertices2);
    this->m_kindex2 = dVar1;
    this->m_status1 = ready;
    this->m_status2 = ready;
  }
  return;
}

Assistant:

void trans_double_path::finalize_paths()
    {
        if(m_status1 == making_path && m_src_vertices1.size() > 1 &&
           m_status2 == making_path && m_src_vertices2.size() > 1)
        {
            m_kindex1 = finalize_path(m_src_vertices1);
            m_kindex2 = finalize_path(m_src_vertices2);
            m_status1 = ready;
            m_status2 = ready;
        }
    }